

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O2

void __thiscall
cppcms::impl::tcp_cache_service::session::on_header_in(session *this,error_code *e,size_t param_2)

{
  pointer pcVar1;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> iStack_68;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_60;
  __shared_ptr<cppcms::impl::tcp_cache_service::session,(__gnu_cxx::_Lock_policy)2> local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  mutable_buffer local_48;
  
  if (e->_M_value != 0) {
    handle_error(this,e);
    return;
  }
  pcVar1 = (this->data_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->data_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar1) {
    (this->data_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_finish = pcVar1;
  }
  std::vector<char,_std::allocator<char>_>::resize(&this->data_in_,(ulong)(this->hin_).size);
  if ((this->hin_).size != 0) {
    booster::aio::buffer(&local_48,&this->data_in_);
    std::__shared_ptr<cppcms::impl::tcp_cache_service::session,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppcms::impl::tcp_cache_service::session,void>
              (local_58,(__weak_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>
                         *)this);
    mfunc_to_io_handler<cppcms::impl::tcp_cache_service::session,std::shared_ptr<cppcms::impl::tcp_cache_service::session>>
              ((offset_in_session_to_subr)&iStack_68,
               (shared_ptr<cppcms::impl::tcp_cache_service::session> *)on_data_in);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    intrusive_ptr(&local_60,&iStack_68);
    booster::aio::stream_socket::async_read((mutable_buffer *)&this->socket_,(callback *)&local_48);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    ~intrusive_ptr(&local_60);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    ~intrusive_ptr(&iStack_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50);
    std::
    _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ::~_Vector_base(&local_48.super_buffer_impl<char_*>.vec_.
                     super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                   );
    return;
  }
  on_data_in(this,e,0);
  return;
}

Assistant:

void on_header_in(booster::system::error_code const &e,size_t)
	{
		if(e) { handle_error(e); return; }
		data_in_.clear();
		data_in_.resize(hin_.size);
		if(hin_.size > 0) {
			socket_.async_read(io::buffer(data_in_),
				mfunc_to_io_handler(&session::on_data_in,shared_from_this()));
		}
		else {
			on_data_in(e,0);
		}
	}